

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

ListReader * __thiscall
capnp::_::OrphanBuilder::asListReader
          (ListReader *__return_storage_ptr__,OrphanBuilder *this,ElementSize elementSize)

{
  SegmentBuilder **ppSVar1;
  ushort uVar2;
  StructPointerCount SVar3;
  CapTableReader *pCVar4;
  ReadLimiter *pRVar5;
  word *pwVar6;
  Arena *pAVar7;
  size_t sVar8;
  bool bVar9;
  char cVar10;
  int iVar11;
  undefined4 extraout_var;
  long lVar13;
  SegmentBuilder *pSVar14;
  CapTableBuilder **ppCVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  ElementSize EVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  SegmentBuilder **ppSVar23;
  OrphanBuilder *pOVar24;
  Fault f;
  Fault local_38;
  SegmentBuilder *pSVar12;
  undefined4 extraout_var_00;
  
  uVar16 = (uint)(this->tag).content;
  if (*(int *)((long)&(this->tag).content + 4) == 0 && uVar16 == 0) goto LAB_00187f74;
  pSVar12 = this->segment;
  pCVar4 = &this->capTable->super_CapTableReader;
  pOVar24 = this;
  if ((uVar16 & 3) == 2 && pSVar12 != (SegmentBuilder *)0x0) {
    iVar11 = (*((pSVar12->super_SegmentReader).arena)->_vptr_Arena[2])();
    pSVar12 = (SegmentBuilder *)CONCAT44(extraout_var,iVar11);
    if (pSVar12 == (SegmentBuilder *)0x0) {
      asListReader();
      ppSVar23 = (SegmentBuilder **)0x0;
    }
    else {
      uVar16 = (uint)(this->tag).content;
      uVar17 = (ulong)(uVar16 >> 3);
      uVar22 = (pSVar12->super_SegmentReader).ptr.size_;
      if ((long)uVar22 < (long)uVar17) {
        uVar17 = uVar22;
      }
      uVar21 = 2 - (ulong)((uVar16 & 4) == 0);
      if (uVar17 + uVar21 <= uVar22) {
        pOVar24 = (OrphanBuilder *)((pSVar12->super_SegmentReader).ptr.ptr + uVar17);
        pRVar5 = (pSVar12->super_SegmentReader).readLimiter;
        uVar22 = pRVar5->limit;
        if (uVar21 <= uVar22) {
          pRVar5->limit = uVar22 - uVar21;
          ppSVar1 = &pOVar24->segment;
          if (((this->tag).content & 4) == 0) {
            lVar13 = (long)((int)(pOVar24->tag).content >> 2);
            pwVar6 = (pSVar12->super_SegmentReader).ptr.ptr;
            ppSVar23 = (SegmentBuilder **)(pwVar6 + (pSVar12->super_SegmentReader).ptr.size_);
            if (((long)pwVar6 - (long)ppSVar1 >> 3 <= lVar13) &&
               (lVar13 <= (long)ppSVar23 - (long)ppSVar1 >> 3)) {
              ppSVar23 = ppSVar1 + lVar13;
            }
          }
          else {
            pAVar7 = (pSVar12->super_SegmentReader).arena;
            iVar11 = (*pAVar7->_vptr_Arena[2])
                               (pAVar7,(ulong)*(uint *)((long)&(pOVar24->tag).content + 4));
            pSVar14 = (SegmentBuilder *)CONCAT44(extraout_var_00,iVar11);
            if (pSVar14 == (SegmentBuilder *)0x0) {
              asListReader();
            }
            else {
              uVar16 = (uint)(pOVar24->tag).content;
              if ((uVar16 & 3) == 2) {
                uVar22 = (ulong)(uVar16 >> 3);
                sVar8 = (pSVar14->super_SegmentReader).ptr.size_;
                if ((long)sVar8 < (long)uVar22) {
                  uVar22 = sVar8;
                }
                ppSVar23 = (SegmentBuilder **)((pSVar14->super_SegmentReader).ptr.ptr + uVar22);
                pSVar12 = pSVar14;
                pOVar24 = (OrphanBuilder *)ppSVar1;
                goto LAB_00187c4c;
              }
              asListReader();
            }
            ppSVar23 = (SegmentBuilder **)0x0;
            pOVar24 = (OrphanBuilder *)ppSVar1;
          }
          goto LAB_00187c4c;
        }
        (*((pSVar12->super_SegmentReader).arena)->_vptr_Arena[3])();
      }
      asListReader();
      ppSVar23 = (SegmentBuilder **)0x0;
      pOVar24 = this;
    }
  }
  else {
    ppSVar23 = (SegmentBuilder **)this->location;
  }
LAB_00187c4c:
  if (ppSVar23 == (SegmentBuilder **)0x0) {
    cVar10 = (ppSVar23 == (SegmentBuilder **)0x0) * '\x02';
  }
  else if (((pOVar24->tag).content & 3) == 1) {
    uVar16 = *(uint *)((long)&(pOVar24->tag).content + 4);
    EVar19 = (ElementSize)uVar16 & INLINE_COMPOSITE;
    if (EVar19 == INLINE_COMPOSITE) {
      uVar22 = (ulong)(uVar16 >> 3);
      if (pSVar12 == (SegmentBuilder *)0x0) {
LAB_00187cc8:
        if ((*(uint *)ppSVar23 & 3) == 0) {
          uVar20 = *(uint *)ppSVar23 >> 2 & 0x1fffffff;
          uVar17 = (ulong)uVar20;
          uVar16 = (uint)*(ushort *)((long)ppSVar23 + 6) + (uint)*(ushort *)((long)ppSVar23 + 4);
          if (uVar16 * uVar17 < uVar22 || uVar16 * uVar17 - uVar22 == 0) {
            if ((pSVar12 != (SegmentBuilder *)0x0) && (uVar16 == 0)) {
              pRVar5 = (pSVar12->super_SegmentReader).readLimiter;
              uVar22 = pRVar5->limit;
              if (uVar22 < uVar17) {
                (*((pSVar12->super_SegmentReader).arena)->_vptr_Arena[3])();
                asListReader();
                goto LAB_00187f66;
              }
              pRVar5->limit = uVar22 - uVar17;
            }
            ppCVar15 = (CapTableBuilder **)(ppSVar23 + 1);
            if (elementSize - 2 < 4) {
              if (*(short *)((long)ppSVar23 + 4) != 0) goto LAB_00187f0d;
              asListReader();
            }
            else if (elementSize == POINTER) {
              if (*(short *)((long)ppSVar23 + 6) != 0) {
                ppCVar15 = ppCVar15 + *(ushort *)((long)ppSVar23 + 4);
                goto LAB_00187f0d;
              }
              asListReader();
            }
            else {
              if (elementSize != BIT) {
LAB_00187f0d:
                uVar2 = *(ushort *)((long)ppSVar23 + 4);
                SVar3 = *(StructPointerCount *)((long)ppSVar23 + 6);
                __return_storage_ptr__->segment = &pSVar12->super_SegmentReader;
                __return_storage_ptr__->capTable = pCVar4;
                __return_storage_ptr__->ptr = (byte *)ppCVar15;
                __return_storage_ptr__->elementCount = uVar20;
                __return_storage_ptr__->step = uVar16 * 0x40;
                __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
                __return_storage_ptr__->structPointerCount = SVar3;
                __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
                __return_storage_ptr__->nestingLimit = 0x7ffffffe;
                cVar10 = '\x01';
                goto LAB_00187f6f;
              }
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                        (&local_38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x905,FAILED,(char *)0x0,
                         "\"Found struct list where bit list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                         ,(char (*) [106])
                          "Found struct list where bit list was expected; upgrading boolean lists to structs is no longer supported."
                        );
              kj::_::Debug::Fault::~Fault(&local_38);
            }
          }
          else {
            asListReader();
          }
        }
        else {
          asListReader();
        }
      }
      else {
        if (((long)ppSVar23 - (long)(pSVar12->super_SegmentReader).ptr.ptr >> 3) + uVar22 + 1 <=
            (pSVar12->super_SegmentReader).ptr.size_) {
          pRVar5 = (pSVar12->super_SegmentReader).readLimiter;
          uVar17 = pRVar5->limit;
          if (uVar22 + 1 <= uVar17) {
            pRVar5->limit = uVar17 - (uVar22 + 1);
            goto LAB_00187cc8;
          }
          (*((pSVar12->super_SegmentReader).arena)->_vptr_Arena[3])();
        }
        asListReader();
      }
    }
    else {
      uVar20 = *(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)EVar19 * 4);
      uVar22 = (ulong)(uVar16 >> 3);
      uVar18 = (uint)(EVar19 == POINTER) * 0x40 + uVar20;
      if (pSVar12 == (SegmentBuilder *)0x0) {
LAB_00187dd0:
        if ((pSVar12 != (SegmentBuilder *)0x0) && ((uVar16 & 7) == 0)) {
          pRVar5 = (pSVar12->super_SegmentReader).readLimiter;
          uVar17 = pRVar5->limit;
          if (uVar17 < uVar22) {
            (*((pSVar12->super_SegmentReader).arena)->_vptr_Arena[3])();
            asListReader();
            goto LAB_00187f66;
          }
          pRVar5->limit = uVar17 - uVar22;
        }
        if ((elementSize != BIT) && (EVar19 == BIT)) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                    (&local_38,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x945,FAILED,(char *)0x0,
                     "\"Found bit list where struct list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                     ,(char (*) [106])
                      "Found bit list where struct list was expected; upgrading boolean lists to structs is no longer supported."
                    );
          kj::_::Debug::Fault::~Fault(&local_38);
          goto LAB_00187e44;
        }
        if (uVar20 < *(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)elementSize * 4)) {
          asListReader();
LAB_00188066:
          cVar10 = '\x02';
          bVar9 = false;
        }
        else {
          cVar10 = '\0';
          bVar9 = true;
          if ((elementSize == POINTER) && (EVar19 != POINTER)) {
            asListReader();
            goto LAB_00188066;
          }
        }
        if (bVar9) {
          __return_storage_ptr__->segment = &pSVar12->super_SegmentReader;
          __return_storage_ptr__->capTable = pCVar4;
          __return_storage_ptr__->ptr = (byte *)ppSVar23;
          __return_storage_ptr__->elementCount = uVar16 >> 3;
          __return_storage_ptr__->step = uVar18;
          __return_storage_ptr__->structDataSize = uVar20;
          __return_storage_ptr__->structPointerCount = (ushort)(EVar19 == POINTER);
          __return_storage_ptr__->elementSize = EVar19;
          __return_storage_ptr__->nestingLimit = 0x7ffffffe;
          cVar10 = '\x01';
        }
        goto LAB_00187f6f;
      }
      uVar17 = uVar18 * uVar22 + 0x3f >> 6 & 0xffffffff;
      if (((long)ppSVar23 - (long)(pSVar12->super_SegmentReader).ptr.ptr >> 3) + uVar17 <=
          (pSVar12->super_SegmentReader).ptr.size_) {
        pRVar5 = (pSVar12->super_SegmentReader).readLimiter;
        uVar21 = pRVar5->limit;
        if (uVar17 <= uVar21) {
          pRVar5->limit = uVar21 - uVar17;
          goto LAB_00187dd0;
        }
        (*((pSVar12->super_SegmentReader).arena)->_vptr_Arena[3])();
      }
      asListReader();
    }
LAB_00187f66:
    cVar10 = '\x02';
  }
  else {
    asListReader();
LAB_00187e44:
    cVar10 = '\x02';
  }
LAB_00187f6f:
  if (cVar10 != '\x02') {
    return __return_storage_ptr__;
  }
LAB_00187f74:
  __return_storage_ptr__->ptr = (byte *)0x0;
  __return_storage_ptr__->elementCount = 0;
  __return_storage_ptr__->step = 0;
  __return_storage_ptr__->segment = (SegmentReader *)0x0;
  __return_storage_ptr__->capTable = (CapTableReader *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
  __return_storage_ptr__->elementSize = elementSize;
  __return_storage_ptr__->nestingLimit = 0x7fffffff;
  return __return_storage_ptr__;
}

Assistant:

ListReader OrphanBuilder::asListReader(ElementSize elementSize) const {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));
  return WireHelpers::readListPointer(
      segment, capTable, tagAsPtr(), location, nullptr, elementSize, kj::maxValue);
}